

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

void __thiscall
VertexClustering::initClusters
          (VertexClustering *this,vector<VCEdge,_std::allocator<VCEdge>_> *edges)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  reference pvVar4;
  reference ppVVar5;
  vector<VCEdge,_std::allocator<VCEdge>_> *in_RSI;
  _Rb_tree_const_iterator<VCFace_*> in_RDI;
  pair<std::_Rb_tree_const_iterator<VCFace_*>,_bool> pVar6;
  int i;
  vector<VCFace_*,_std::allocator<VCFace_*>_> faces_vec;
  VCFace *f;
  int r;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> faces;
  int n;
  VCFace *in_stack_fffffffffffffef8;
  key_type *in_stack_ffffffffffffff00;
  VCCluster *this_00;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *in_stack_ffffffffffffff08;
  value_type in_stack_ffffffffffffff10;
  value_type *in_stack_ffffffffffffff18;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  _Rb_tree_const_iterator<VCFace_*> in_stack_ffffffffffffff30;
  iterator in_stack_ffffffffffffff38;
  int local_b8;
  vector<VCFace_*,_std::allocator<VCFace_*>_> local_a0;
  _Base_ptr local_88;
  undefined1 local_80;
  _Self local_78 [3];
  _Self local_60;
  VCFace *local_58;
  int local_4c;
  int local_14;
  vector<VCEdge,_std::allocator<VCEdge>_> *local_10;
  
  local_10 = in_RSI;
  sVar2 = std::vector<VCEdge,_std::allocator<VCEdge>_>::size(in_RSI);
  local_14 = (int)sVar2;
  std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::set
            ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)0x2814a5);
  if ((ulong)(long)local_14 < *(ulong *)(in_RDI._M_node + 6)) {
    *(long *)(in_RDI._M_node + 6) = (long)local_14;
  }
  while (sVar3 = std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::size
                           ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)
                            0x2814e1), sVar3 < *(ulong *)(in_RDI._M_node + 6)) {
    do {
      local_4c = rand();
      local_4c = local_4c % local_14;
      pvVar4 = std::vector<VCEdge,_std::allocator<VCEdge>_>::operator[](local_10,(long)local_4c);
      local_58 = pvVar4->f1;
      in_stack_ffffffffffffff38 =
           std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::find
                     (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      local_60._M_node = in_stack_ffffffffffffff38._M_node;
      local_78[0]._M_node =
           (_Base_ptr)
           std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::end
                     ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)
                      in_stack_fffffffffffffef8);
      bVar1 = std::operator==(&local_60,local_78);
    } while (!bVar1);
    pVar6 = std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::insert
                      (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff30 = pVar6.first._M_node;
    in_stack_ffffffffffffff2f = pVar6.second;
    local_88 = in_stack_ffffffffffffff30._M_node;
    local_80 = in_stack_ffffffffffffff2f;
  }
  std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::begin
            ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)
             in_stack_fffffffffffffef8);
  std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::end
            ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)
             in_stack_fffffffffffffef8);
  std::allocator<VCFace_*>::allocator((allocator<VCFace_*> *)0x281618);
  std::vector<VCFace*,std::allocator<VCFace*>>::vector<std::_Rb_tree_const_iterator<VCFace*>,void>
            ((vector<VCFace_*,_std::allocator<VCFace_*>_> *)in_stack_ffffffffffffff30._M_node,in_RDI
             ,(_Rb_tree_const_iterator<VCFace_*>)in_stack_ffffffffffffff38._M_node,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  std::allocator<VCFace_*>::~allocator((allocator<VCFace_*> *)0x28163d);
  for (local_b8 = 0; (ulong)(long)local_b8 < *(ulong *)(in_RDI._M_node + 6); local_b8 = local_b8 + 1
      ) {
    this_00 = (VCCluster *)&(in_RDI._M_node)->_M_left;
    std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::operator[]
              ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)this_00,0);
    ppVVar5 = std::vector<VCFace_*,_std::allocator<VCFace_*>_>::operator[](&local_a0,(long)local_b8)
    ;
    in_stack_ffffffffffffff10 = *ppVVar5;
    std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::operator[]
              ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)this_00,(long)(local_b8 + 1));
    VCCluster::giveItem(this_00,in_stack_fffffffffffffef8,(VCCluster *)0x2816b7);
  }
  std::vector<VCFace_*,_std::allocator<VCFace_*>_>::~vector
            ((vector<VCFace_*,_std::allocator<VCFace_*>_> *)in_stack_ffffffffffffff10);
  std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::~set
            ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)0x281722);
  return;
}

Assistant:

void VertexClustering::initClusters(vector<VCEdge>& edges) {
	int n = edges.size();
	set<VCFace*> faces;
	if (opts.numCluster > n)
		opts.numCluster = n;
	while (faces.size() < opts.numCluster) {
		while (true) {
			int r = rand() % n;
			VCFace* f = edges[r].f1;
			if (faces.find(f) == faces.end()) {
				faces.insert(f);
				break;
			}
		}
	}
	vector<VCFace*> faces_vec(faces.begin(), faces.end());
	for (int i = 0; i < opts.numCluster; ++i) {
		clusters[0]->giveItem(faces_vec[i], clusters[i + 1]);
	}
	
}